

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap_client.cpp
# Opt level: O2

void __thiscall zmq::zap_client_t::handle_zap_status_code(zap_client_t *this)

{
  socket_base_t *this_00;
  endpoint_uri_pair_t *endpoint_uri_pair_;
  int err_;
  
  switch(*(this->status_code)._M_dataplus._M_p) {
  case '2':
    return;
  case '3':
    err_ = 300;
    break;
  case '4':
    err_ = 400;
    break;
  case '5':
    err_ = 500;
    break;
  default:
    err_ = 0;
  }
  this_00 = session_base_t::get_socket
                      (*(session_base_t **)(&this->field_0x590 + (long)this->_vptr_zap_client_t[-3])
                      );
  endpoint_uri_pair_ =
       session_base_t::get_endpoint
                 (*(session_base_t **)(&this->field_0x590 + (long)this->_vptr_zap_client_t[-3]));
  socket_base_t::event_handshake_failed_auth(this_00,endpoint_uri_pair_,err_);
  return;
}

Assistant:

void zap_client_t::handle_zap_status_code ()
{
    //  we can assume here that status_code is a valid ZAP status code,
    //  i.e. 200, 300, 400 or 500
    int status_code_numeric = 0;
    switch (status_code[0]) {
        case '2':
            return;
        case '3':
            status_code_numeric = 300;
            break;
        case '4':
            status_code_numeric = 400;
            break;
        case '5':
            status_code_numeric = 500;
            break;
    }

    session->get_socket ()->event_handshake_failed_auth (
      session->get_endpoint (), status_code_numeric);
}